

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_map(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  int iVar2;
  sxi32 sVar3;
  jx9_value *pValue_00;
  uint local_cc;
  sxi32 rc;
  sxu32 n;
  jx9_hashmap *pMap;
  jx9_hashmap_node *pEntry;
  jx9_value sResult;
  jx9_value sKey;
  jx9_value *pValue;
  jx9_value *pArray;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((1 < nArg) && (iVar2 = jx9_value_is_json_array(apArg[1]), iVar2 != 0)) {
    pValue_00 = jx9_context_new_array(pCtx);
    if (pValue_00 == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
      return 0;
    }
    puVar1 = (undefined8 *)(apArg[1]->x).pOther;
    jx9MemObjInit((jx9_vm *)*puVar1,(jx9_value *)&pEntry);
    jx9MemObjInit((jx9_vm *)*puVar1,(jx9_value *)&sResult.nIdx);
    pMap = (jx9_hashmap *)puVar1[2];
    for (local_cc = 0; local_cc < *(uint *)((long)puVar1 + 0x2c); local_cc = local_cc + 1) {
      sKey._56_8_ = HashmapExtractNodeValue((jx9_hashmap_node *)pMap);
      if ((jx9_value *)sKey._56_8_ != (jx9_value *)0x0) {
        sVar3 = jx9VmCallUserFunction
                          ((jx9_vm *)*puVar1,*apArg,1,(jx9_value **)&sKey.nIdx,(jx9_value *)&pEntry)
        ;
        jx9HashmapExtractNodeKey((jx9_hashmap_node *)pMap,(jx9_value *)&sResult.nIdx);
        if (sVar3 == 0) {
          jx9_array_add_elem(pValue_00,(jx9_value *)&sResult.nIdx,(jx9_value *)&pEntry);
        }
        else {
          jx9_array_add_elem(pValue_00,(jx9_value *)&sResult.nIdx,(jx9_value *)sKey._56_8_);
        }
        jx9MemObjRelease((jx9_value *)&sResult.nIdx);
        jx9MemObjRelease((jx9_value *)&pEntry);
      }
      pMap = (jx9_hashmap *)pMap->iNextIdx;
    }
    jx9_result_value(pCtx,pValue_00);
    return 0;
  }
  jx9_result_null(pCtx);
  return 0;
}

Assistant:

static int jx9_hashmap_map(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pArray, *pValue, sKey, sResult;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[1]) ){
		/* Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[1]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sResult);
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the requested operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extrcat the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			sxi32 rc;
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunction(pMap->pVm, apArg[0], 1, &pValue, &sResult);
			/* Extract the node key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_array_add_elem(pArray, &sKey, pValue); /* Keep the same value */
			}else{
				/* Insert the callback return value */
				jx9_array_add_elem(pArray, &sKey, &sResult);
			}
			jx9MemObjRelease(&sKey);
			jx9MemObjRelease(&sResult);
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}